

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass-utils.h
# Opt level: O3

void __thiscall
wasm::PassUtils::FilteredPass::runOnFunction(FilteredPass *this,Module *module,Function *func)

{
  PassRunner *pPVar1;
  Pass *pPVar2;
  PassRunner *pPVar3;
  const_iterator cVar4;
  Function *local_20;
  Function *func_local;
  
  local_20 = func;
  cVar4 = std::
          _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this->relevantFuncs->_M_h,&local_20);
  if (cVar4.super__Node_iterator_base<wasm::Function_*,_false>._M_cur != (__node_type *)0x0) {
    pPVar1 = (this->super_Pass).runner;
    pPVar2 = (this->pass)._M_t.super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
             super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    pPVar3 = pPVar2->runner;
    if (pPVar3 != pPVar1 && pPVar3 != (PassRunner *)0x0) {
      __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                    ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
    }
    pPVar2->runner = pPVar1;
    pPVar2 = (this->pass)._M_t.super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
             super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    (*pPVar2->_vptr_Pass[3])(pPVar2,module,local_20);
  }
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    if (!relevantFuncs.count(func)) {
      return;
    }

    // The pass runner calling us set our pass runner, which we must do for the
    // wrapped pass.
    pass->setPassRunner(getPassRunner());
    pass->runOnFunction(module, func);
  }